

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayTests.cpp
# Opt level: O0

void __thiscall Array1dTest_GetSize_Test::TestBody(Array1dTest_GetSize_Test *this)

{
  bool bVar1;
  IndexType_conflict1 IVar2;
  AssertHelper *this_00;
  AssertionResult gtest_ar;
  Array1d<double> a;
  Array1d<double> *in_stack_ffffffffffffff78;
  int *in_stack_ffffffffffffff80;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  char *actual_expression;
  int in_stack_ffffffffffffff9c;
  char *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  Type in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  IndexType_conflict1 in_stack_ffffffffffffffb4;
  AssertionResult local_38;
  Message *in_stack_ffffffffffffffd8;
  AssertHelper *in_stack_ffffffffffffffe0;
  
  pica::Vector1<int>::Vector1((Vector1<int> *)&stack0xffffffffffffffdc,6);
  actual_expression = &stack0xffffffffffffffe0;
  pica::Array1d<double>::Array1d
            ((Array1d<double> *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             in_stack_ffffffffffffffb4,(ValueType)in_stack_ffffffffffffffa0);
  IVar2 = pica::Array1d<double>::getSize(in_stack_ffffffffffffff78);
  testing::internal::EqHelper<false>::Compare<int,int>
            ((char *)CONCAT44(in_stack_ffffffffffffff9c,IVar2.x),actual_expression,
             (int *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88),
             in_stack_ffffffffffffff80);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_38);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_ffffffffffffffb4.x,in_stack_ffffffffffffffb0));
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x229643)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffffb4.x,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
               actual_expression);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x229691);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2296e1);
  pica::Array1d<double>::~Array1d((Array1d<double> *)0x2296fd);
  return;
}

Assistant:

TEST(Array1dTest, GetSize)
{
    const Array1d<double> a(6);
    ASSERT_EQ(6, a.getSize().x); 
}